

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall
t_go_generator::generate_deserialize_container
          (t_go_generator *this,ostream *out,t_type *orig_type,bool pointer_field,bool declare,
          string *prefix)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  t_map *tmap;
  ostream *poVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  size_type *psVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  undefined7 in_register_00000081;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string eq;
  string local_120;
  undefined4 local_fc;
  string local_f8;
  char *local_d8;
  char *local_d0;
  char local_c8 [16];
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_fc = (undefined4)CONCAT71(in_register_00000009,pointer_field);
  tmap = (t_map *)t_type::get_true_type(orig_type);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," = ","");
  if ((int)CONCAT71(in_register_00000081,declare) != 0) {
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x387881);
  }
  iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])(tmap);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(tmap);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])(tmap);
      if ((char)iVar4 == '\0') {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])(tmap);
        std::operator+(&local_50,"INVALID TYPE IN generate_deserialize_container \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar4));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_f8._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_f8._M_dataplus._M_p == psVar7) {
          local_f8.field_2._M_allocated_capacity = *psVar7;
          local_f8.field_2._8_8_ = plVar6[3];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar7;
        }
        local_f8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::operator+(&local_120,&local_f8,prefix);
        std::operator+(__return_storage_ptr__,&local_120,"\'");
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"_, size, err := iprot.ReadListBegin(ctx)",0x28);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if err != nil {",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  return thrift.PrependError(\"error reading list begin: \", err)",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"tSlice := make(",0xf);
      type_to_go_type_with_opt_abi_cxx11_(&local_f8,this,orig_type,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", 0, size)",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d8,(long)local_d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "";
      if ((byte)local_fc != 0) {
        pcVar8 = "&";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(byte)local_fc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"tSlice",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"_, size, err := iprot.ReadSetBegin(ctx)",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if err != nil {",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  return thrift.PrependError(\"error reading set begin: \", err)",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"tSet := make(",0xd);
      type_to_go_type_with_opt_abi_cxx11_(&local_f8,this,orig_type,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", 0, size)",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d8,(long)local_d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "";
      if ((byte)local_fc != 0) {
        pcVar8 = "&";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(byte)local_fc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"tSet",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    local_b8 = prefix;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"_, _, size, err := iprot.ReadMapBegin(ctx)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    paVar2 = &local_120.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if err != nil {",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  return thrift.PrependError(\"error reading map begin: \", err)",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"tMap := make(",0xd);
    type_to_go_type_with_opt_abi_cxx11_(&local_f8,this,orig_type,false);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", size)",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d8,(long)local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar8 = "";
    if ((byte)local_fc != 0) {
      pcVar8 = "&";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(byte)local_fc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"tMap",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    prefix = local_b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
      prefix = local_b8;
    }
  }
  t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_120._M_dataplus._M_p,local_120._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"for i := 0; i < size; i ++ {",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar2 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if ((char)local_fc != '\0') {
    std::operator+(&local_f8,"(*",prefix);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120.field_2._8_8_ = plVar6[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_120._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)prefix,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])(tmap);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(tmap);
    if ((char)iVar4 != '\0') {
      paVar10 = &local_90.field_2;
      pcVar3 = (prefix->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + prefix->_M_string_length);
      generate_deserialize_set_element(this,out,(t_set *)tmap,false,&local_90);
      _Var9._M_p = local_90._M_dataplus._M_p;
      goto LAB_002148dc;
    }
    iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])(tmap);
    if ((char)iVar4 != '\0') {
      paVar10 = &local_b0.field_2;
      pcVar3 = (prefix->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + prefix->_M_string_length);
      generate_deserialize_list_element(this,out,(t_list *)tmap,false,&local_b0);
      _Var9._M_p = local_b0._M_dataplus._M_p;
      goto LAB_002148dc;
    }
  }
  else {
    paVar10 = &local_70.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + prefix->_M_string_length);
    generate_deserialize_map_element(this,out,tmap,false,&local_70);
    _Var9._M_p = local_70._M_dataplus._M_p;
LAB_002148dc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != paVar10) {
      operator_delete(_Var9._M_p);
    }
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_120._M_dataplus._M_p,local_120._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])(tmap);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(tmap);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])(tmap);
      if ((char)iVar4 == '\0') goto LAB_00214c9d;
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"if err := iprot.ReadListEnd(ctx); err != nil {",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  return thrift.PrependError(\"error reading list end: \", err)",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"if err := iprot.ReadSetEnd(ctx); err != nil {",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  return thrift.PrependError(\"error reading set end: \", err)",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"if err := iprot.ReadMapEnd(ctx); err != nil {",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  return thrift.PrependError(\"error reading map end: \", err)",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
LAB_00214c9d:
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void t_go_generator::generate_deserialize_container(ostream& out,
                                                    t_type* orig_type,
                                                    bool pointer_field,
                                                    bool declare,
                                                    string prefix) {
  t_type* ttype = get_true_type(orig_type);
  string eq(" = ");

  if (declare) {
    eq = " := ";
  }

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "_, _, size, err := iprot.ReadMapBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading map begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tMap := make(" << type_to_go_type(orig_type) << ", size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tMap" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "_, size, err := iprot.ReadSetBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading set begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tSet := make(" << type_to_go_type(orig_type) << ", 0, size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tSet" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "_, size, err := iprot.ReadListBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading list begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tSlice := make(" << type_to_go_type(orig_type) << ", 0, size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tSlice" << endl;
  } else {
    throw "INVALID TYPE IN generate_deserialize_container '" + ttype->get_name() + "' for prefix '"
        + prefix + "'";
  }

  // For loop iterates over elements
  out << indent() << "for i := 0; i < size; i ++ {" << endl;
  indent_up();

  if (pointer_field) {
    prefix = "(*" + prefix + ")";
  }
  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, declare, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, declare, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, declare, prefix);
  }

  indent_down();
  out << indent() << "}" << endl;

  // Read container end
  if (ttype->is_map()) {
    out << indent() << "if err := iprot.ReadMapEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading map end: \", err)" << endl;
    out << indent() << "}" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "if err := iprot.ReadSetEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading set end: \", err)" << endl;
    out << indent() << "}" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "if err := iprot.ReadListEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading list end: \", err)" << endl;
    out << indent() << "}" << endl;
  }
}